

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
* mocker::buildBlockPredecessors
            (unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             *__return_storage_ptr__,FunctionModule *func)

{
  bool bVar1;
  BasicBlockList *pBVar2;
  mapped_type *pmVar3;
  size_t local_c8;
  reference local_c0;
  unsigned_long *s;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> succ;
  BasicBlock *bb_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  BasicBlockList *__range1_1;
  initializer_list<unsigned_long> local_60;
  BasicBlock *local_50;
  BasicBlock *bb;
  const_iterator __end1;
  const_iterator __begin1;
  BasicBlockList *__range1;
  FunctionModule *func_local;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *res;
  
  std::
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::unordered_map(__return_storage_ptr__);
  pBVar2 = ir::FunctionModule::getBBs_abi_cxx11_(func);
  __end1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(pBVar2);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (pBVar2);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&bb), bVar1) {
    local_50 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end1);
    std::initializer_list<unsigned_long>::initializer_list(&local_60);
    __range1_1 = (BasicBlockList *)ir::BasicBlock::getLabelID(local_50);
    pmVar3 = std::
             unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator[](__return_storage_ptr__,(key_type *)&__range1_1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(pmVar3,local_60);
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end1);
  }
  pBVar2 = ir::FunctionModule::getBBs_abi_cxx11_(func);
  __end1_1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
             begin(pBVar2);
  bb_1 = (BasicBlock *)
         std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                   (pBVar2);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&bb_1), bVar1) {
    succ.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         &std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end1_1)->labelID;
    ir::BasicBlock::getSuccessors
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range2,
               (BasicBlock *)
               succ.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range2);
    s = (unsigned_long *)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&s), bVar1) {
      local_c0 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end2);
      pmVar3 = std::
               unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator[](__return_storage_ptr__,local_c0);
      local_c8 = ir::BasicBlock::getLabelID
                           ((BasicBlock *)
                            succ.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (pmVar3,&local_c8);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range2);
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<std::size_t, std::vector<std::size_t>>
buildBlockPredecessors(const ir::FunctionModule &func) {
  std::unordered_map<std::size_t, std::vector<std::size_t>> res;
  for (auto &bb : func.getBBs())
    res[bb.getLabelID()] = {};

  for (auto &bb : func.getBBs()) {
    auto succ = bb.getSuccessors();
    for (auto &s : succ)
      res[s].emplace_back(bb.getLabelID());
  }

  return res;
}